

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FileDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FileDescriptorProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  int size;
  uint uVar3;
  char *pcVar4;
  string *psVar5;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  ServiceDescriptorProto *value_01;
  FieldDescriptorProto *value_02;
  uint8 *target_00;
  UnknownFieldSet *unknown_fields;
  uint local_68;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  FileDescriptorProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileDescriptorProto.name");
    psVar5 = name_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(1,psVar5,target);
  }
  if ((uVar1 & 2) != 0) {
    package_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileDescriptorProto.package");
    psVar5 = package_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(2,psVar5,_i);
  }
  i_1 = 0;
  iVar2 = dependency_size(this);
  for (; (int)i_1 < iVar2; i_1 = i_1 + 1) {
    dependency_abi_cxx11_(this,i_1);
    pcVar4 = (char *)std::__cxx11::string::data();
    dependency_abi_cxx11_(this,i_1);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,size,SERIALIZE,"google.protobuf.FileDescriptorProto.dependency");
    psVar5 = dependency_abi_cxx11_(this,i_1);
    _i = internal::WireFormatLite::WriteStringToArray(3,psVar5,_i);
  }
  i_2 = 0;
  uVar3 = message_type_size(this);
  for (; i_2 < uVar3; i_2 = i_2 + 1) {
    value = message_type(this,i_2);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::DescriptorProto>
                   (4,value,deterministic,_i);
  }
  i_3 = 0;
  uVar3 = enum_type_size(this);
  for (; i_3 < uVar3; i_3 = i_3 + 1) {
    value_00 = enum_type(this,i_3);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::EnumDescriptorProto>
                   (5,value_00,deterministic,_i);
  }
  i_4 = 0;
  uVar3 = service_size(this);
  for (; i_4 < uVar3; i_4 = i_4 + 1) {
    value_01 = service(this,i_4);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::ServiceDescriptorProto>
                   (6,value_01,deterministic,_i);
  }
  local_68 = 0;
  uVar3 = extension_size(this);
  for (; local_68 < uVar3; local_68 = local_68 + 1) {
    value_02 = extension(this,local_68);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::FieldDescriptorProto>
                   (7,value_02,deterministic,_i);
  }
  if ((uVar1 & 8) != 0) {
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::FileOptions>
                   (8,this->options_,deterministic,_i);
  }
  if ((uVar1 & 0x10) != 0) {
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::SourceCodeInfo>
                   (9,this->source_code_info_,deterministic,_i);
  }
  target_00 = internal::WireFormatLite::WriteInt32ToArray(10,&this->public_dependency_,_i);
  _i = internal::WireFormatLite::WriteInt32ToArray(0xb,&this->weak_dependency_,target_00);
  if ((uVar1 & 4) != 0) {
    syntax_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    syntax_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileDescriptorProto.syntax");
    psVar5 = syntax_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(0xc,psVar5,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FileDescriptorProto::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* FileDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->dependency(i), target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0, n = this->message_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, this->message_type(i), deterministic, target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, this->enum_type(i), deterministic, target);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0, n = this->service_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->service(i), deterministic, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, this->extension(i), deterministic, target);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->options_, deterministic, target);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, *this->source_code_info_, deterministic, target);
  }

  // repeated int32 public_dependency = 10;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(10, this->public_dependency_, target);

  // repeated int32 weak_dependency = 11;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(11, this->weak_dependency_, target);

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->syntax().data(), this->syntax().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        12, this->syntax(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}